

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void __thiscall
google::protobuf::internal::KeyMapBase<unsigned_long>::InsertUnique
          (KeyMapBase<unsigned_long> *this,map_index_t b,KeyNode *node)

{
  unsigned_long uVar1;
  LogMessage *pLVar2;
  NodeBase **ppNVar3;
  uint *puVar4;
  bool bVar5;
  NodeAndBucket NVar6;
  NodeBase **head;
  LogMessage local_68;
  Voidify local_51;
  NodeBase *local_50;
  map_index_t local_48;
  byte local_39;
  LogMessage local_38;
  Voidify local_21;
  NodeBase *local_20;
  KeyNode *node_local;
  KeyMapBase<unsigned_long> *pKStack_10;
  map_index_t b_local;
  KeyMapBase<unsigned_long> *this_local;
  
  local_39 = 0;
  bVar5 = true;
  if ((this->super_UntypedMapBase).index_of_first_non_null_ !=
      (this->super_UntypedMapBase).num_buckets_) {
    bVar5 = (this->super_UntypedMapBase).table_
            [(this->super_UntypedMapBase).index_of_first_non_null_] != (NodeBase *)0x0;
  }
  local_20 = &node->super_NodeBase;
  node_local._4_4_ = b;
  pKStack_10 = this;
  if (!bVar5) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
               ,0x310,
               "index_of_first_non_null_ == num_buckets_ || table_[index_of_first_non_null_] != nullptr"
              );
    local_39 = 1;
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_38);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_21,pLVar2);
  }
  if ((local_39 & 1) == 0) {
    uVar1 = KeyNode<unsigned_long>::key((KeyNode<unsigned_long> *)local_20);
    uVar1 = TransparentSupport<unsigned_long>::ToView(uVar1);
    NVar6 = FindHelper(this,uVar1);
    local_50 = NVar6.node;
    local_48 = NVar6.bucket;
    if (local_50 != (NodeBase *)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_68,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
                 ,0x315,"FindHelper(TS::ToView(node->key())).node == nullptr");
      pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_68);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_51,pLVar2);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_68);
    }
    AssertLoadFactor(this);
    ppNVar3 = (this->super_UntypedMapBase).table_ + node_local._4_4_;
    if (*ppNVar3 == (NodeBase *)0x0) {
      *ppNVar3 = local_20;
      local_20->next = (NodeBase *)0x0;
      puVar4 = std::min<unsigned_int>
                         (&(this->super_UntypedMapBase).index_of_first_non_null_,
                          (uint *)((long)&node_local + 4));
      (this->super_UntypedMapBase).index_of_first_non_null_ = *puVar4;
    }
    else {
      bVar5 = UntypedMapBase::ShouldInsertAfterHead(&this->super_UntypedMapBase,local_20);
      if (bVar5) {
        local_20->next = (*ppNVar3)->next;
        (*ppNVar3)->next = local_20;
      }
      else {
        local_20->next = *ppNVar3;
        *ppNVar3 = local_20;
      }
    }
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_38);
}

Assistant:

void InsertUnique(map_index_t b, KeyNode* node) {
    ABSL_DCHECK(index_of_first_non_null_ == num_buckets_ ||
                table_[index_of_first_non_null_] != nullptr);
    // In practice, the code that led to this point may have already
    // determined whether we are inserting into an empty list, a short list,
    // or whatever.  But it's probably cheap enough to recompute that here;
    // it's likely that we're inserting into an empty or short list.
    ABSL_DCHECK(FindHelper(TS::ToView(node->key())).node == nullptr);
    AssertLoadFactor();
    auto*& head = table_[b];
    if (head == nullptr) {
      head = node;
      node->next = nullptr;
      index_of_first_non_null_ = (std::min)(index_of_first_non_null_, b);
    } else if (ShouldInsertAfterHead(node)) {
      node->next = head->next;
      head->next = node;
    } else {
      node->next = head;
      head = node;
    }
  }